

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_WAKE(effect_handler_context_t_conflict *context)

{
  ushort uVar1;
  bool bVar2;
  wchar_t wVar3;
  loc_conflict grid1;
  monster *mon_00;
  source origin_00;
  wchar_t dist;
  wchar_t radius;
  monster *mon;
  loc_conflict origin;
  _Bool woken;
  wchar_t i;
  effect_handler_context_t_conflict *context_local;
  
  bVar2 = false;
  origin_00._4_4_ = 0;
  origin_00.what = (context->origin).what;
  origin_00.which.trap = (context->origin).which.trap;
  grid1 = origin_get_loc(origin_00);
  for (origin.y = L'\x01'; wVar3 = cave_monster_max(cave), origin.y < wVar3;
      origin.y = origin.y + L'\x01') {
    mon_00 = (monster *)cave_monster(cave,origin.y);
    if (((mon_00->race != (monster_race *)0x0) &&
        (uVar1 = z_info->max_sight, wVar3 = distance((loc)grid1,(loc)mon_00->grid),
        wVar3 < (int)((uint)uVar1 << 1))) && (mon_00->m_timed[0] != 0)) {
      monster_wake(mon_00,false,wVar3 * -2 + L'd');
      bVar2 = true;
    }
  }
  if (bVar2) {
    msg("You hear a sudden stirring in the distance!");
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_WAKE(effect_handler_context_t *context)
{
	int i;
	bool woken = false;

	struct loc origin = origin_get_loc(context->origin);

	/* Wake everyone nearby */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		if (mon->race) {
			int radius = z_info->max_sight * 2;
			int dist = distance(origin, mon->grid);

			/* Skip monsters too far away */
			if ((dist < radius) && mon->m_timed[MON_TMD_SLEEP]) {
				/* Monster wakes, closer means likelier to become aware */
				monster_wake(mon, false, 100 - 2 * dist);
				woken = true;
			}
		}
	}

	/* Messages */
	if (woken) {
		msg("You hear a sudden stirring in the distance!");
	}

	context->ident = true;

	return true;
}